

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O3

Object * __thiscall
flatbuffers::BaseBfbsGenerator::GetObject(BaseBfbsGenerator *this,Type *type,bool element_type)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  Schema *pSVar4;
  long lVar5;
  unsigned_short vtsize;
  undefined7 in_register_00000011;
  ulong uVar6;
  bool bVar7;
  
  lVar5 = -(long)*(int *)type;
  uVar1 = *(ushort *)(type + -(long)*(int *)type);
  if ((int)CONCAT71(in_register_00000011,element_type) == 0) {
    if (uVar1 < 5) {
      return (Object *)0x0;
    }
    uVar2 = *(ushort *)(type + lVar5 + 4);
  }
  else {
    if (uVar1 < 7) {
      return (Object *)0x0;
    }
    uVar2 = *(ushort *)(type + lVar5 + 6);
  }
  if (uVar2 == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = type[uVar2].super_Table == (Table)0xf;
  }
  if ((((8 < uVar1) && ((ulong)*(ushort *)(type + lVar5 + 8) != 0)) &&
      (iVar3 = *(int *)(type + *(ushort *)(type + lVar5 + 8)), (bool)(-1 < iVar3 & bVar7))) &&
     (pSVar4 = this->schema_, pSVar4 != (Schema *)0x0)) {
    uVar6 = (ulong)*(ushort *)(pSVar4 + (4 - (long)*(int *)pSVar4));
    if (iVar3 < *(int *)(pSVar4 + *(uint *)(pSVar4 + uVar6) + uVar6)) {
      lVar5 = *(uint *)(pSVar4 + uVar6) + uVar6;
      return (Object *)
             (pSVar4 + (ulong)*(uint *)(pSVar4 + (ulong)(uint)(iVar3 << 2) + lVar5 + 4) +
                       (ulong)(uint)(iVar3 << 2) + lVar5 + 4);
    }
  }
  return (Object *)0x0;
}

Assistant:

const reflection::Object *GetObject(const reflection::Type *type,
                                      bool element_type = false) const {
    const reflection::BaseType base_type =
        element_type ? type->element() : type->base_type();
    if (type->index() >= 0 && IsStructOrTable(base_type)) {
      return GetObjectByIndex(type->index());
    }
    return nullptr;
  }